

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O2

Vector3<long_double> *
s2pred::GetClosestVertex<long_double>
          (Vector3<long_double> *__return_storage_ptr__,Vector3<long_double> *x,
          Vector3<long_double> *a0,Vector3<long_double> *a1,longdouble *ax2)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  Vector3<long_double> *pVVar7;
  longdouble in_ST0;
  longdouble lVar8;
  longdouble in_ST1;
  BasicVector<Vector3,_long_double,_3UL> local_68 [56];
  
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::operator-
            ((BasicVector<Vector3,_long_double,_3UL> *)a0,x);
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::Norm2(local_68);
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::operator-
            ((BasicVector<Vector3,_long_double,_3UL> *)a1,x);
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::Norm2(local_68);
  pVVar7 = a0;
  lVar8 = in_ST0;
  if (in_ST1 <= in_ST0) {
    pVVar7 = a1;
    lVar8 = in_ST1;
    if (((in_ST0 == in_ST1) && (!NAN(in_ST0) && !NAN(in_ST1))) &&
       (bVar6 = util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::operator<
                          ((BasicVector<Vector3,_long_double,_3UL> *)a0,a1), bVar6))
    goto LAB_00254cce;
  }
  a0 = pVVar7;
  in_ST0 = lVar8;
LAB_00254cce:
  *ax2 = in_ST0;
  uVar1 = *(undefined8 *)a0->c_;
  uVar2 = *(undefined8 *)((long)a0->c_ + 8);
  uVar3 = *(undefined8 *)(a0->c_ + 1);
  uVar4 = *(undefined8 *)((long)a0->c_ + 0x18);
  uVar5 = *(undefined8 *)((long)a0->c_ + 0x28);
  *(undefined8 *)(__return_storage_ptr__->c_ + 2) = *(undefined8 *)(a0->c_ + 2);
  *(undefined8 *)((long)__return_storage_ptr__->c_ + 0x28) = uVar5;
  *(undefined8 *)(__return_storage_ptr__->c_ + 1) = uVar3;
  *(undefined8 *)((long)__return_storage_ptr__->c_ + 0x18) = uVar4;
  *(undefined8 *)__return_storage_ptr__->c_ = uVar1;
  *(undefined8 *)((long)__return_storage_ptr__->c_ + 8) = uVar2;
  return __return_storage_ptr__;
}

Assistant:

inline Vector3<T> GetClosestVertex(const Vector3<T>& x, const Vector3<T>& a0,
                                   const Vector3<T>& a1, T* ax2) {
  T a0x2 = (a0 - x).Norm2();
  T a1x2 = (a1 - x).Norm2();
  if (a0x2 < a1x2 || (a0x2 == a1x2 && a0 < a1)) {
    *ax2 = a0x2;
    return a0;
  } else {
    *ax2 = a1x2;
    return a1;
  }
}